

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gravity_parser_t * gravity_parser_create(char *source,size_t len,uint32_t fileid,_Bool is_static)

{
  size_t sVar1;
  gravity_parser_t *parser_00;
  gravity_lexer_t *pgVar2;
  lexer_r *plVar3;
  gravity_lexer_t **ppgVar4;
  gnode_r *pgVar5;
  size_t local_40;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser;
  _Bool is_static_local;
  uint32_t fileid_local;
  size_t len_local;
  char *source_local;
  
  init_grammer_rules();
  parser_00 = (gravity_parser_t *)gravity_calloc((gravity_vm *)0x0,1,0x60);
  if (parser_00 != (gravity_parser_t *)0x0) {
    pgVar2 = gravity_lexer_create(source,len,fileid,is_static);
    if (pgVar2 != (gravity_lexer_t *)0x0) {
      plVar3 = (lexer_r *)gravity_calloc((gravity_vm *)0x0,1,0x18);
      parser_00->lexer = plVar3;
      parser_00->lexer->m = 0;
      parser_00->lexer->n = 0;
      parser_00->lexer->p = (gravity_lexer_t **)0x0;
      if (parser_00->lexer->n == parser_00->lexer->m) {
        if (parser_00->lexer->m == 0) {
          local_40 = 8;
        }
        else {
          local_40 = parser_00->lexer->m << 1;
        }
        parser_00->lexer->m = local_40;
        ppgVar4 = (gravity_lexer_t **)realloc(parser_00->lexer->p,parser_00->lexer->m << 3);
        parser_00->lexer->p = ppgVar4;
      }
      ppgVar4 = parser_00->lexer->p;
      sVar1 = parser_00->lexer->n;
      parser_00->lexer->n = sVar1 + 1;
      ppgVar4[sVar1] = pgVar2;
      pgVar5 = gnode_array_create();
      parser_00->statements = pgVar5;
      if (parser_00->statements != (gnode_r *)0x0) {
        pgVar5 = gnode_array_create();
        parser_00->declarations = pgVar5;
        if (parser_00->declarations != (gnode_r *)0x0) {
          (parser_00->vdecl).m = 0;
          (parser_00->vdecl).n = 0;
          (parser_00->vdecl).p = (uint16_t *)0x0;
          parser_00->last_error_lineno = 0xffffffff;
          return parser_00;
        }
      }
    }
    gravity_parser_free(parser_00);
  }
  return (gravity_parser_t *)0x0;
}

Assistant:

gravity_parser_t *gravity_parser_create (const char *source, size_t len, uint32_t fileid, bool is_static) {
    init_grammer_rules();

    gravity_parser_t *parser = mem_alloc(NULL, sizeof(gravity_parser_t));
    if (!parser) return NULL;

    gravity_lexer_t *lexer = gravity_lexer_create(source, len, fileid, is_static);
    if (!lexer) goto abort_init;

    parser->lexer = mem_alloc(NULL, sizeof(lexer_r));
    marray_init(*parser->lexer);
    marray_push(gravity_lexer_t*, *parser->lexer, lexer);

    parser->statements = gnode_array_create();
    if (!parser->statements) goto abort_init;

    parser->declarations = gnode_array_create();
    if (!parser->declarations) goto abort_init;

    marray_init(parser->vdecl);
    
    parser->last_error_lineno = UINT32_MAX;
    return parser;

abort_init:
    gravity_parser_free(parser);
    return NULL;
}